

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O2

void __thiscall
cmInstalledFile::AppendProperty
          (cmInstalledFile *this,cmMakefile *mf,string *prop,char *value,bool param_4)

{
  vector<cmCompiledGeneratorExpression*,std::allocator<cmCompiledGeneratorExpression*>> *this_00;
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  undefined1 local_70 [48];
  cmListFileBacktrace local_40;
  
  cmMakefile::GetBacktrace(&local_40,mf);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)(local_70 + 0x10),&local_40)
  ;
  this_00 = (vector<cmCompiledGeneratorExpression*,std::allocator<cmCompiledGeneratorExpression*>> *
            )std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
             ::operator[](&this->Properties,prop);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_70,local_70 + 0x10);
  local_70._8_8_ = local_70._0_8_;
  local_70._0_8_ = (cmState *)0x0;
  std::vector<cmCompiledGeneratorExpression*,std::allocator<cmCompiledGeneratorExpression*>>::
  emplace_back<cmCompiledGeneratorExpression*>
            (this_00,(cmCompiledGeneratorExpression **)(local_70 + 8));
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_70);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_70 + 0x10));
  cmListFileBacktrace::~cmListFileBacktrace(&local_40);
  return;
}

Assistant:

void cmInstalledFile::AppendProperty(cmMakefile const* mf,
                                     const std::string& prop,
                                     const char* value, bool /*asString*/)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(backtrace);

  Property& property = this->Properties[prop];
  property.ValueExpressions.push_back(ge.Parse(value).release());
}